

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O0

void print_bittiming_one(alg *alg,can_bittiming_const *bittiming_const,can_bittiming *ref_bt,
                        calc_ref_clk *ref_clk,uint bitrate_nominal,uint sample_point_nominal,
                        _func_void_can_bittiming_ptr__Bool *printf_btr,_Bool quiet,_Bool verbose,
                        _Bool fd_mode)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  uint *in_RCX;
  ulong *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  uint in_R8D;
  uint in_R9D;
  char *pcVar4;
  code *in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  int __x_1;
  int __x;
  uint sample_point_error;
  uint bitrate_error;
  can_bittiming bt;
  net_device dev;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 uVar5;
  undefined4 uVar6;
  uint local_b0;
  uint local_ac;
  char *local_a8;
  undefined8 local_58;
  ulong local_50;
  ulong local_48;
  undefined8 local_40;
  uint local_38;
  byte local_33;
  byte local_32;
  byte local_31;
  uint local_30;
  uint local_2c;
  uint *local_28;
  ulong *local_20;
  long local_18;
  undefined8 *local_10;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_31 = in_stack_00000010 & 1;
  local_32 = in_stack_00000018 & 1;
  local_33 = in_stack_00000020 & 1;
  local_38 = *in_RCX;
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_58,0,0x20);
  local_58 = CONCAT44(local_30,local_2c);
  if ((local_31 & 1) == 0) {
    pcVar2 = "";
    if ((local_33 & 1) != 0) {
      pcVar2 = "Data ";
    }
    pcVar3 = "";
    if (*(long *)(local_28 + 2) != 0) {
      pcVar3 = "(";
    }
    if (*(long *)(local_28 + 2) == 0) {
      local_a8 = "";
    }
    else {
      local_a8 = *(char **)(local_28 + 2);
    }
    pcVar4 = "";
    if (*(long *)(local_28 + 2) != 0) {
      pcVar4 = ") ";
    }
    uVar5 = local_10[2];
    printf("%sBit timing parameters for %s with %.6f MHz ref clock %s%s%susing algo \'%s\'\n",
           (double)*local_28 / 1000000.0,pcVar2,local_18,pcVar3,local_a8,pcVar4,uVar5);
    uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
    if ((local_32 & 1) == 0) {
      printf(" nominal                                  real  Bitrt    nom   real   SampP\n");
    }
    else {
      uVar5 = CONCAT44(uVar6,*(undefined4 *)(local_18 + 0x20));
      printf(anon_var_dwarf_74b,(ulong)*(uint *)(local_18 + 0x10),(ulong)*(uint *)(local_18 + 0x14),
             (ulong)*(uint *)(local_18 + 0x18),(ulong)*(uint *)(local_18 + 0x1c),1,uVar5,
             *(undefined4 *)(local_18 + 0x24),*(undefined4 *)(local_18 + 0x28),
             *(undefined4 *)(local_18 + 0x2c));
      uVar6 = (undefined4)((ulong)uVar5 >> 0x20);
      printf(" nominal          |    |    |   |   |     real  Bitrt    nom   real   SampP\n");
    }
    printf(" Bitrate TQ[ns] PrS PhS1 PhS2 SJW BRP  Bitrate  Error  SampP  SampP   Error  ");
    (*in_stack_00000008)(&local_58,1);
    printf("\n");
  }
  if (local_20 == (ulong *)0x0) {
    iVar1 = (*(code *)*local_10)(&local_38,&local_58,local_18);
    if (iVar1 != 0) {
      printf("%8d ***bitrate not possible***\n",(ulong)local_2c);
      return;
    }
  }
  else {
    local_58 = *local_20;
    local_50 = local_20[1];
    local_48 = local_20[2];
    local_40 = local_20[3];
    iVar1 = (*(code *)local_10[1])(&local_38,&local_58,local_18);
    if (iVar1 != 0) {
      printf("%8d ***parameters exceed controller\'s range***\n",(ulong)local_2c);
      return;
    }
  }
  local_ac = local_2c - (int)local_58;
  if ((int)local_ac < 0) {
    local_ac = -local_ac;
  }
  local_b0 = local_30 - local_58._4_4_;
  if ((int)local_b0 < 0) {
    local_b0 = -local_b0;
  }
  printf("%8d %6d %3d %4d %4d %3d %3d %8d  ",(ulong)local_2c,local_50 & 0xffffffff,local_50 >> 0x20,
         local_48 & 0xffffffff,local_48 >> 0x20,CONCAT44(uVar6,(undefined4)local_40),local_40._4_4_,
         (int)local_58);
  if (((double)local_ac * 100.0) / (double)local_2c <= 99.9) {
    printf("%4.1f%%  ",((double)local_ac * 100.0) / (double)local_2c);
  }
  else {
    printf(anon_var_dwarf_7d5);
  }
  printf("%4.1f%%  %4.1f%%  ",(double)local_30 / 10.0,(double)(local_58 >> 0x20) / 10.0);
  if (((double)local_b0 * 100.0) / (double)local_30 <= 99.9) {
    printf("%4.1f%%   ",((double)local_b0 * 100.0) / (double)local_30);
  }
  else {
    printf(anon_var_dwarf_7f6);
  }
  (*in_stack_00000008)(&local_58,0);
  printf("\n");
  return;
}

Assistant:

static void print_bittiming_one(const struct alg *alg,
				const struct can_bittiming_const *bittiming_const,
				const struct can_bittiming *ref_bt,
				const struct calc_ref_clk *ref_clk,
				unsigned int bitrate_nominal,
				unsigned int sample_point_nominal,
				void (*printf_btr)(struct can_bittiming *bt, bool hdr),
				bool quiet,
				bool verbose,
				bool fd_mode)
{
	struct net_device dev = {
		.priv.clock.freq = ref_clk->clk,
	};
	struct can_bittiming bt = {
		.bitrate = bitrate_nominal,
		.sample_point = sample_point_nominal,
	};
	unsigned int bitrate_error, sample_point_error;

	if (!quiet) {
		printf("%sBit timing parameters for %s with %.6f MHz ref clock %s%s%susing algo '%s'\n",
		       fd_mode ? "Data " : "",
		       bittiming_const->name,
		       ref_clk->clk / 1000000.0,
		       ref_clk->name ? "(" : "",
		       ref_clk->name ? ref_clk->name : "",
		       ref_clk->name ? ") " : "",
		       alg->name);
		if (verbose) {
			printf("                    _----+--------------=> TSeg1: %u … %4u\n"
			       "                   /    /     _---------=> TSeg2: %u … %4u\n"
			       "                  |    |     /    _-----=> SJW:   %u … %4u\n"
			       "                  |    |    |    /    _-=> BRP:   %u … %4u (inc: %u)\n"
			       "                  |    |    |   |    /\n",
			       bittiming_const->tseg1_min, bittiming_const->tseg1_max,
			       bittiming_const->tseg2_min, bittiming_const->tseg2_max,
			       1, bittiming_const->sjw_max,
			       bittiming_const->brp_min, bittiming_const->brp_max, bittiming_const->brp_inc);
			printf(" nominal          |    |    |   |   |     real  Bitrt    nom   real   SampP\n");
		} else {
			printf(" nominal                                  real  Bitrt    nom   real   SampP\n");
		}
		printf(" Bitrate TQ[ns] PrS PhS1 PhS2 SJW BRP  Bitrate  Error  SampP  SampP   Error  ");

		printf_btr(&bt, true);
		printf("\n");
	}

	if (ref_bt) {
		bt = *ref_bt;

		if (alg->fixup_bittiming(&dev, &bt, bittiming_const)) {
			printf("%8d ***parameters exceed controller's range***\n", bitrate_nominal);
			return;
		}
	} else {
		if (alg->calc_bittiming(&dev, &bt, bittiming_const)) {
			printf("%8d ***bitrate not possible***\n", bitrate_nominal);
			return;
		}
	}

	bitrate_error = abs(bitrate_nominal - bt.bitrate);
	sample_point_error = abs(sample_point_nominal - bt.sample_point);

	printf("%8d "				/* Bitrate */
	       "%6d %3d %4d %4d "		/* TQ[ns], PrS, PhS1, PhS2 */
	       "%3d %3d "			/* SJW, BRP */
	       "%8d  ",				/* real Bitrate */
	       bitrate_nominal,
	       bt.tq, bt.prop_seg, bt.phase_seg1, bt.phase_seg2,
	       bt.sjw, bt.brp,
	       bt.bitrate);

	if (100.0 * bitrate_error / bitrate_nominal > 99.9)
		printf("≥100%%  ");
	else
		printf("%4.1f%%  ",		/* Bitrate Error */
		       100.0 * bitrate_error / bitrate_nominal);

	printf("%4.1f%%  %4.1f%%  ",		/* nom Sample Point, real Sample Point */
	       sample_point_nominal / 10.0,
	       bt.sample_point / 10.0);

	if (100.0 * sample_point_error / sample_point_nominal > 99.9)
		printf("≥100%%   ");
	else
		printf("%4.1f%%   ",		/* Sample Point Error */
		       100.0 * sample_point_error / sample_point_nominal);

	printf_btr(&bt, false);
	printf("\n");
}